

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::StringMakerBase<true>::convert<std::__cxx11::string>
          (String *__return_storage_ptr__,StringMakerBase<true> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in)

{
  ostream *poVar1;
  
  poVar1 = tlssPush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,*(char **)this,*(long *)(this + 8));
  tlssPop();
  return __return_storage_ptr__;
}

Assistant:

static String convert(const DOCTEST_REF_WRAP(T) in) {
            /* When parameter "in" is a null terminated const char* it works.
             * When parameter "in" is a T arr[N] without '\0' we can fill the
             * stringstream with N objects (T=char).If in is char pointer *
             * without '\0' , it would cause segfault
             * stepping over unaccessible memory.
             */

            std::ostream* stream = tlssPush();
            filloss(stream, in);
            return tlssPop();
        }